

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void luaL_pushmodule(lua_State *L,char *modname,int sizehint)

{
  int iVar1;
  char *pcVar2;
  int in_EDX;
  lua_State *in_RSI;
  lua_State *in_RDI;
  undefined4 unaff_retaddr;
  lua_State *in_stack_00000018;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  
  luaL_findtable(in_stack_00000018,L._4_4_,modname,sizehint);
  lua_getfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  iVar1 = lua_type(in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (iVar1 != 5) {
    lua_settop(in_RSI,in_EDX);
    pcVar2 = luaL_findtable(in_stack_00000018,L._4_4_,modname,sizehint);
    if (pcVar2 != (char *)0x0) {
      lj_err_callerv(in_RDI,LJ_ERR_BADMODN,in_RSI);
    }
    lua_pushvalue((lua_State *)CONCAT44(sizehint,unaff_retaddr),(int)((ulong)in_RDI >> 0x20));
    lua_setfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  }
  lua_remove(in_RSI,in_EDX);
  return;
}

Assistant:

LUALIB_API void luaL_pushmodule(lua_State *L, const char *modname, int sizehint)
{
  luaL_findtable(L, LUA_REGISTRYINDEX, "_LOADED", 16);
  lua_getfield(L, -1, modname);
  if (!lua_istable(L, -1)) {
    lua_pop(L, 1);
    if (luaL_findtable(L, LUA_GLOBALSINDEX, modname, sizehint) != NULL)
      lj_err_callerv(L, LJ_ERR_BADMODN, modname);
    lua_pushvalue(L, -1);
    lua_setfield(L, -3, modname);  /* _LOADED[modname] = new table. */
  }
  lua_remove(L, -2);  /* Remove _LOADED table. */
}